

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

int ecx_readOEsingle(ecx_contextt *context,uint16 Item,uint8 SubI,ec_ODlistt *pODlist,
                    ec_OElistt *pOElist)

{
  ushort slave;
  uint16 Index_00;
  uint8 uVar1;
  int iVar2;
  uint8 local_848 [6];
  uint8 uStack_842;
  uint8 cnt;
  ec_mbxbuft MbxOut;
  ec_mbxbuft MbxIn;
  short local_40;
  ushort local_3a;
  int16 n;
  uint16 Slave;
  uint16 Index;
  uint16 wkc;
  ec_SDOservicet *aSDOp;
  ec_SDOservicet *SDOp;
  ec_OElistt *pOElist_local;
  ec_ODlistt *pODlist_local;
  uint8 SubI_local;
  uint16 Item_local;
  ecx_contextt *context_local;
  
  slave = pODlist->Slave;
  Index_00 = pODlist->Index[Item];
  ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
  ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),0);
  ec_clearmbx((ec_mbxbuft *)local_848);
  local_848[0] = '\n';
  local_848[1] = '\0';
  local_848[2] = '\0';
  local_848[3] = '\0';
  local_848[4] = '\0';
  uVar1 = ec_nextmbxcnt(context->slavelist[slave].mbx_cnt);
  context->slavelist[slave].mbx_cnt = uVar1;
  local_848[5] = uVar1 * '\x10' + '\x03';
  uStack_842 = '\0';
  cnt = 0x80;
  MbxOut[0] = '\x05';
  MbxOut[1] = '\0';
  MbxOut[2] = '\0';
  MbxOut[3] = '\0';
  MbxOut[7] = '\a';
  MbxOut._4_2_ = Index_00;
  MbxOut[6] = SubI;
  iVar2 = ecx_mbxsend(context,slave,(ec_mbxbuft *)local_848,20000);
  local_3a = (ushort)iVar2;
  if (local_3a != 0) {
    ec_clearmbx((ec_mbxbuft *)(MbxOut + 0x3f8));
    iVar2 = ecx_mbxreceive(context,slave,(ec_mbxbuft *)(MbxOut + 0x3f8),700000);
    local_3a = (ushort)iVar2;
    if (local_3a != 0) {
      if (((MbxOut[0x3fd] & 0xf) == 3) && ((MbxIn[0] & 0x7f) == 6)) {
        pOElist->Entries = pOElist->Entries + 1;
        local_40 = MbxOut._1016_2_ + -0x10;
        if (0x28 < local_40) {
          local_40 = 0x28;
        }
        if (local_40 < 0) {
          local_40 = 0;
        }
        pOElist->ValueInfo[SubI] = MbxIn[7];
        pOElist->DataType[SubI] = MbxIn._8_2_;
        pOElist->BitLength[SubI] = MbxIn._10_2_;
        pOElist->ObjAccess[SubI] = MbxIn._12_2_;
        strncpy(pOElist->Name[SubI],(char *)(MbxIn + 0xe),(long)local_40);
        pOElist->Name[SubI][local_40] = '\0';
      }
      else {
        if ((MbxIn[0] & 0x7f) == 7) {
          ecx_SDOinfoerror(context,slave,Index_00,SubI,MbxIn._4_4_);
        }
        else {
          ecx_packeterror(context,slave,Index_00,SubI,1);
        }
        local_3a = 0;
      }
    }
  }
  return (int)local_3a;
}

Assistant:

int ecx_readOEsingle(ecx_contextt *context, uint16 Item, uint8 SubI, ec_ODlistt *pODlist, ec_OElistt *pOElist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   uint16 wkc, Index, Slave;
   int16 n;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;

   wkc = 0;
   Slave = pODlist->Slave;
   Index = pODlist->Index[Item];
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x000a);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_OE_REQ; /* get object entry description request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0;      /* fragments left */
   SDOp->wdata[0] = htoes(Index);      /* Index */
   SDOp->bdata[2] = SubI;       /* SubIndex */
   SDOp->bdata[3] = 1 + 2 + 4; /* get access rights, object category, PDO */
   /* send get object entry description request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      ec_clearmbx(&MbxIn);
      /* read slave response */
      wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
      /* got response ? */
      if (wkc > 0)
      {
         if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
             ((aSDOp->Opcode &  0x7f) == ECT_GET_OE_RES))
         {
            pOElist->Entries++;
            n = (etohs(aSDOp->MbxHeader.length) - 16); /* length of string(name of object) */
            if (n > EC_MAXNAME)
            {
               n = EC_MAXNAME; /* max string length */
            }
            if (n < 0 )
            {
               n = 0;
            }
            pOElist->ValueInfo[SubI] = aSDOp->bdata[3];
            pOElist->DataType[SubI] = etohs(aSDOp->wdata[2]);
            pOElist->BitLength[SubI] = etohs(aSDOp->wdata[3]);
            pOElist->ObjAccess[SubI] = etohs(aSDOp->wdata[4]);

            strncpy(pOElist->Name[SubI] , (char *)&aSDOp->wdata[5], n);
            pOElist->Name[SubI][n] = 0x00; /* string terminator */
         }
         /* got unexpected response from slave */
         else
         {
            if (((aSDOp->Opcode & 0x7f) == ECT_SDOINFO_ERROR)) /* SDO info error received */
            {
               ecx_SDOinfoerror(context, Slave, Index, SubI, etohl(aSDOp->ldata[0]));
            }
            else
            {
               ecx_packeterror(context, Slave, Index, SubI, 1); /* Unexpected frame returned */
            }
            wkc = 0;
         }
      }
   }
   
   return wkc;
}